

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *local_330;
  float *local_318;
  stbir__contributors *local_310;
  float fStack_210;
  float fStack_204;
  float local_1f8;
  float fStack_1dc;
  float fStack_1d0;
  float fStack_1c4;
  float local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  
  local_330 = output_buffer;
  local_318 = horizontal_coefficients;
  local_310 = horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (local_310->n0 << 2);
    local_1b8 = (float)*(undefined8 *)local_318;
    local_e8 = (float)*(undefined8 *)pfVar1;
    fStack_e4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_1c4 = (float)((ulong)*(undefined8 *)local_318 >> 0x20);
    local_108 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_104 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(local_318 + 2);
    local_128 = (float)*(undefined8 *)(pfVar1 + 8);
    fStack_124 = (float)((ulong)*(undefined8 *)(pfVar1 + 8) >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_1dc = (float)((ulong)*(undefined8 *)(local_318 + 2) >> 0x20);
    local_148 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_144 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    local_1f8 = (float)*(undefined8 *)(local_318 + 4);
    local_168 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_164 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfVar1 + 0x12);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x12) >> 0x20);
    fStack_204 = (float)((ulong)*(undefined8 *)(local_318 + 4) >> 0x20);
    local_188 = (float)*(undefined8 *)(pfVar1 + 0x14);
    fStack_184 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x14) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfVar1 + 0x16);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x16) >> 0x20);
    fStack_210 = (float)*(undefined8 *)(local_318 + 6);
    local_1a8 = (float)*(undefined8 *)(pfVar1 + 0x18);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x18) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar1 + 0x1a);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1a) >> 0x20);
    *(ulong *)local_330 =
         CONCAT44(local_1b8 * fStack_e4 + fStack_1d0 * fStack_124 + local_1f8 * fStack_164 +
                  fStack_210 * fStack_1a4 +
                  fStack_1c4 * fStack_104 + fStack_1dc * fStack_144 + fStack_204 * fStack_184,
                  local_1b8 * local_e8 + fStack_1d0 * local_128 + local_1f8 * local_168 +
                  fStack_210 * local_1a8 +
                  fStack_1c4 * local_108 + fStack_1dc * local_148 + fStack_204 * local_188);
    *(ulong *)(local_330 + 2) =
         CONCAT44(local_1b8 * fStack_dc + fStack_1d0 * fStack_11c + local_1f8 * fStack_15c +
                  fStack_210 * fStack_19c +
                  fStack_1c4 * fStack_fc + fStack_1dc * fStack_13c + fStack_204 * fStack_17c,
                  local_1b8 * fStack_e0 + fStack_1d0 * fStack_120 + local_1f8 * fStack_160 +
                  fStack_210 * fStack_1a0 +
                  fStack_1c4 * fStack_100 + fStack_1dc * fStack_140 + fStack_204 * fStack_180);
    local_318 = local_318 + coefficient_width;
    local_310 = local_310 + 1;
    local_330 = local_330 + 4;
  } while (local_330 < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}